

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

bool __thiscall wirehair::Codec::OpportunisticPeeling(Codec *this,uint16_t row_i,uint32_t row_seed)

{
  PeelRowParameters *this_00;
  anon_union_2_3_10dc256e_for_PeelColumn_1 *paVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  PeelColumn *pPVar6;
  PeelRefs *pPVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined6 in_register_00000032;
  short sVar11;
  uint uVar12;
  uint uVar13;
  PeelRefs *pPVar14;
  bool bVar15;
  uint16_t unmarked [2];
  ushort local_3c [2];
  PeelRow *local_38;
  
  uVar10 = CONCAT62(in_register_00000032,row_i) & 0xffffffff;
  this_00 = &this->_peel_rows[uVar10].Params;
  local_38 = this->_peel_rows + uVar10;
  *(uint32_t *)((long)(this_00 + -1) + 4) = row_seed;
  PeelRowParameters::Initialize(this_00,row_seed,this->_p_seed,this->_block_count,this->_mix_count);
  uVar2 = this_00->PeelAdd;
  uVar10 = (ulong)this_00->PeelFirst;
  uVar3 = this->_block_count;
  uVar4 = this->_block_next_prime;
  pPVar6 = this->_peel_cols;
  pPVar7 = this->_peel_col_refs;
  uVar12 = 0;
  sVar11 = this_00->PeelCount - 1;
  do {
    uVar9 = uVar10 & 0xffff;
    uVar5 = pPVar7[uVar9].RowCount;
    if (0x1f < (ulong)uVar5) {
      FixPeelFailure(this,local_38,(uint16_t)uVar10);
LAB_0010279e:
      return uVar5 < 0x20;
    }
    pPVar14 = pPVar7 + uVar9;
    pPVar14->RowCount = uVar5 + 1;
    pPVar14->Rows[uVar5] = row_i;
    if (pPVar6[uVar9].Mark == '\0') {
      local_3c[uVar12 & 1] = (uint16_t)uVar10;
      uVar12 = uVar12 + 1;
    }
    bVar15 = sVar11 == 0;
    sVar11 = sVar11 + -1;
    if (bVar15) {
      local_38->UnmarkedCount = (uint16_t)uVar12;
      if ((uint16_t)uVar12 == 2) {
        (local_38->Marks).Unmarked[0] = local_3c[0];
        (local_38->Marks).Unmarked[1] = local_3c[1];
        paVar1 = &this->_peel_cols[local_3c[0]].field_1;
        paVar1->Weight2Refs = paVar1->Weight2Refs + 1;
        paVar1 = &this->_peel_cols[local_3c[1]].field_1;
        paVar1->Weight2Refs = paVar1->Weight2Refs + 1;
      }
      else if ((uVar12 & 0xffff) == 1) {
        SolveWithPeel(this,local_38,row_i,local_3c[0]);
      }
      else if ((uVar12 & 0xffff) == 0) {
        local_38->NextRow = this->_defer_head_rows;
        this->_defer_head_rows = row_i;
      }
      goto LAB_0010279e;
    }
    uVar10 = (ulong)((int)uVar9 + (uint)uVar2) % (ulong)uVar4;
    if ((uint)uVar3 <= (uint)uVar10) {
      uVar8 = (uint)uVar4 - (uint)uVar10;
      uVar13 = uVar8 & 0xffff;
      if (uVar2 < (ushort)uVar8) {
        uVar10 = (ulong)((uint)uVar2 * 0x10000 - uVar13) % (ulong)(uint)uVar2;
      }
      else {
        uVar10 = (ulong)(uVar2 - uVar13);
      }
    }
  } while( true );
}

Assistant:

bool Codec::OpportunisticPeeling(
    const uint16_t row_i, ///< Row index
    const uint32_t row_seed ///< Row PRNG seed
)
{
    PeelRow *row = &_peel_rows[row_i];

    row->RecoveryId = row_seed;

    row->Params.Initialize(row_seed, _p_seed, _block_count, _mix_count);

    CAT_IF_DUMP(cout << "Row " << row_seed << " in slot " << row_i << " of weight "
        << row->Params.PeelCount << " [a=" << row->Params.PeelAdd << "] : ";)

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

    uint16_t unmarked_count = 0;
    uint16_t unmarked[2];

    // Iterate columns in peeling matrix
    do
    {
        const uint16_t column_i = iter.GetColumn();

        CAT_IF_DUMP(cout << column_i << " ";)

        PeelRefs *refs = &_peel_col_refs[column_i];

        // If there was not enough room in the reference list:
        if (refs->RowCount >= CAT_REF_LIST_MAX)
        {
            CAT_IF_DUMP(cout << "OpportunisticPeeling: Failure!  " \
                "Ran out of space for row references.  CAT_REF_LIST_MAX must be increased!" << endl;)

            CAT_DEBUG_BREAK();

            FixPeelFailure(row, column_i);

            return false;
        }

        // Add row reference to column
        refs->Rows[refs->RowCount++] = row_i;

        // If column is unmarked:
        if (_peel_cols[column_i].Mark == MARK_TODO) {
            unmarked[unmarked_count++ & 1] = column_i;
        }
    } while (iter.Iterate());

    CAT_IF_DUMP(cout << endl;)

    // Initialize row state
    row->UnmarkedCount = unmarked_count;

    switch (unmarked_count)
    {
    case 0:
        // Link at head of defer list
        row->NextRow = _defer_head_rows;
        _defer_head_rows = row_i;
        break;

    case 1:
        // Solve only unmarked column with this row
        SolveWithPeel(
            row,
            row_i,
            unmarked[0]);
        break;

    case 2:
        // Remember which two columns were unmarked
        row->Marks.Unmarked[0] = unmarked[0];
        row->Marks.Unmarked[1] = unmarked[1];

        // Increment weight-2 reference count for unmarked columns
        _peel_cols[unmarked[0]].Weight2Refs++;
        _peel_cols[unmarked[1]].Weight2Refs++;
        break;
    }

    return true;
}